

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_extract_aux(REF_NODE ref_node,REF_INT *ldim,REF_DBL **aux)

{
  uint uVar1;
  uint uVar2;
  REF_DBL *pRVar3;
  ulong uVar4;
  long lVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  
  uVar1 = ref_node->naux;
  *ldim = uVar1;
  uVar2 = ref_node->max;
  if ((int)(uVar2 * uVar1) < 0) {
    RVar6 = 1;
    pcVar10 = "malloc *aux of REF_DBL negative";
  }
  else {
    pRVar3 = (REF_DBL *)malloc((ulong)(uVar2 * uVar1) << 3);
    *aux = pRVar3;
    if (pRVar3 != (REF_DBL *)0x0) {
      uVar11 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar11 = 0;
      }
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      lVar5 = 0;
      for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
        lVar8 = lVar5;
        uVar9 = uVar4;
        if (-1 < ref_node->global[uVar7]) {
          while (uVar9 != 0) {
            *(undefined8 *)((long)pRVar3 + lVar8) = *(undefined8 *)((long)ref_node->aux + lVar8);
            lVar8 = lVar8 + 8;
            uVar9 = uVar9 - 1;
          }
        }
        lVar5 = lVar5 + (long)(int)uVar1 * 8;
      }
      return 0;
    }
    RVar6 = 2;
    pcVar10 = "malloc *aux of REF_DBL NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa97,
         "ref_node_extract_aux",pcVar10);
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_extract_aux(REF_NODE ref_node, REF_INT *ldim,
                                        REF_DBL **aux) {
  REF_INT iaux, node;
  (*ldim) = ref_node_naux(ref_node);
  ref_malloc(*aux, (*ldim) * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (iaux = 0; iaux < ref_node_naux(ref_node); iaux++) {
      (*aux)[iaux + (*ldim) * node] = ref_node_aux(ref_node, iaux, node);
    }
  }
  return REF_SUCCESS;
}